

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O3

void __thiscall Book::Book(Book *this,string *name,double price)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  Product::Product(&this->super_Product,&local_38,price);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_Product)._vptr_Product = (_func_int **)&PTR_printProperties_00110b48;
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  (this->author)._M_string_length = 0;
  (this->author).field_2._M_local_buf[0] = '\0';
  (this->publisher)._M_dataplus._M_p = (pointer)&(this->publisher).field_2;
  (this->publisher)._M_string_length = 0;
  (this->publisher).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Book::Book(string name, double price):Product(name,price){

}